

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkylineBinPack.cpp
# Opt level: O1

void __thiscall
SkylineBinPack::AddSkylineLevel(SkylineBinPack *this,int skylineNodeIndex,Rect *rect)

{
  uint uVar1;
  SkylineNode *__dest;
  SkylineNode *pSVar2;
  uint uVar3;
  uint uVar4;
  int in_ECX;
  int iVar5;
  int iVar6;
  SkylineNode newNode;
  SkylineNode local_34;
  
  if (this->useWasteMap == true) {
    AddWasteMapArea(this,skylineNodeIndex,rect->width,in_ECX,rect->y);
  }
  local_34.x = rect->x;
  local_34.y = rect->height + rect->y;
  local_34.width = rect->width;
  TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::Insert
            (&this->skyLine,skylineNodeIndex,&local_34);
  if (this->binWidth < local_34.width + local_34.x) {
    __assert_fail("newNode.x + newNode.width <= binWidth",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/SkylineBinPack.cpp"
                  ,0xe1,"void SkylineBinPack::AddSkylineLevel(int, const Rect &)");
  }
  if (this->binHeight < local_34.y) {
    __assert_fail("newNode.y <= binHeight",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/SkylineBinPack.cpp"
                  ,0xe2,"void SkylineBinPack::AddSkylineLevel(int, const Rect &)");
  }
  do {
    uVar1 = skylineNodeIndex + 1;
    uVar4 = (this->skyLine).Count;
    if (uVar4 <= uVar1) break;
    pSVar2 = (this->skyLine).Array;
    iVar5 = pSVar2[uVar1].x;
    if (iVar5 < pSVar2[(uint)skylineNodeIndex].x) {
      __assert_fail("skyLine[i-1].x <= skyLine[i].x",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/SkylineBinPack.cpp"
                    ,0xe6,"void SkylineBinPack::AddSkylineLevel(int, const Rect &)");
    }
    iVar6 = pSVar2[(uint)skylineNodeIndex].x + pSVar2[(uint)skylineNodeIndex].width;
    if (iVar6 <= iVar5) break;
    __dest = pSVar2 + uVar1;
    __dest->x = iVar6;
    iVar5 = (iVar5 - iVar6) + __dest->width;
    __dest->width = iVar5;
    uVar3 = uVar1;
    if (iVar5 < 1) {
      uVar4 = uVar4 - 1;
      (this->skyLine).Count = uVar4;
      uVar3 = skylineNodeIndex;
      if (uVar1 <= uVar4 && uVar4 - uVar1 != 0) {
        memmove(__dest,pSVar2 + (skylineNodeIndex + 2),(ulong)(uVar4 - uVar1) * 0xc);
      }
    }
    skylineNodeIndex = uVar3;
  } while (iVar5 < 1);
  MergeSkylines(this);
  return;
}

Assistant:

void SkylineBinPack::AddSkylineLevel(int skylineNodeIndex, const Rect &rect)
{
	// First track all wasted areas and mark them into the waste map if we're using one.
	if (useWasteMap)
		AddWasteMapArea(skylineNodeIndex, rect.width, rect.height, rect.y);

	SkylineNode newNode;
	newNode.x = rect.x;
	newNode.y = rect.y + rect.height;
	newNode.width = rect.width;
	skyLine.Insert(skylineNodeIndex, newNode);

	assert(newNode.x + newNode.width <= binWidth);
	assert(newNode.y <= binHeight);

	for(unsigned i = skylineNodeIndex+1; i < skyLine.Size(); ++i)
	{
		assert(skyLine[i-1].x <= skyLine[i].x);

		if (skyLine[i].x < skyLine[i-1].x + skyLine[i-1].width)
		{
			int shrink = skyLine[i-1].x + skyLine[i-1].width - skyLine[i].x;

			skyLine[i].x += shrink;
			skyLine[i].width -= shrink;

			if (skyLine[i].width <= 0)
			{
				skyLine.Delete(i);
				--i;
			}
			else
				break;
		}
		else
			break;
	}
	MergeSkylines();
}